

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varsub.c
# Opt level: O0

void varsub(int qnum,int vnum,int flags)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  long lVar6;
  char *pcVar7;
  uint in_EDX;
  uint in_ESI;
  uint in_EDI;
  long tmp2;
  long tmp1;
  long tmp_date;
  int i;
  char *ptr;
  long *lptr;
  long in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  long in_stack_ffffffffffffff98;
  distribution *in_stack_ffffffffffffffa0;
  distribution *nStream;
  long in_stack_ffffffffffffffa8;
  long in_stack_ffffffffffffffb0;
  long local_30;
  int local_24;
  char *local_20;
  
  if (varsub::bInit == 0) {
    sprintf(varsub::formats[4],"19%s-%s-01","%02ld");
    sprintf(varsub::formats[5],"19%s-01-01","%02ld");
    sprintf(varsub::formats[6],"19%s-01-01","%02ld");
    sprintf(varsub::formats[7],"0.%s","%02ld");
    sprintf(varsub::formats[10],"19%s-%s-01","%02ld");
    sprintf(varsub::formats[0xc],"19%s-01-01","%02ld");
    sprintf(varsub::formats[0xe],"19%s-%s-01","%02ld");
    sprintf(varsub::formats[0xf],"19%s-%s-01","%02ld");
    sprintf(varsub::formats[0x10],"Brand#%s%s","%ld");
    sprintf(varsub::formats[0x11],"Brand#%s%s","%ld");
    sprintf(varsub::formats[0x13],"Brand#%s%s","%ld");
    sprintf(varsub::formats[0x14],"19%s-01-01","%02ld");
    varsub::bInit = 1;
  }
  if (in_ESI == 0) {
    if ((in_EDX & 1) == 0) {
      iVar2 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
      switch(in_EDI) {
      case 1:
        lVar6 = UnifInt(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                        (long)in_stack_ffffffffffffffa0);
        sprintf(varsub::param[1],"%ld",lVar6);
        varsub::param[2][0] = '\0';
        break;
      case 2:
        lVar6 = UnifInt(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                        (long)in_stack_ffffffffffffffa0);
        iVar2 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
        sprintf(varsub::param[1],"%ld",lVar6);
        pick_str(in_stack_ffffffffffffffa0,iVar2,in_stack_ffffffffffffff90);
        sVar4 = strlen(varsub::param[3]);
        for (local_20 = varsub::param[3] + (int)sVar4; local_20[-1] != ' '; local_20 = local_20 + -1
            ) {
        }
        strcpy(varsub::param[2],local_20);
        pick_str(in_stack_ffffffffffffffa0,iVar2,in_stack_ffffffffffffff90);
        varsub::param[4][0] = '\0';
        break;
      case 3:
        pick_str(in_stack_ffffffffffffffa0,iVar2,in_stack_ffffffffffffff90);
        dss_random((long *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                   (long)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        strcpy(varsub::param[2],asc_date[local_30 + 0x483]);
        varsub::param[3][0] = '\0';
        break;
      case 4:
        lVar6 = UnifInt(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                        (long)in_stack_ffffffffffffffa0);
        sprintf(varsub::param[1],varsub::formats[4],lVar6 / 0xc + 0x5d,lVar6 % 0xc + 1);
        varsub::param[2][0] = '\0';
        break;
      case 5:
        pick_str(in_stack_ffffffffffffffa0,iVar2,in_stack_ffffffffffffff90);
        lVar6 = UnifInt(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                        (long)in_stack_ffffffffffffffa0);
        sprintf(varsub::param[2],varsub::formats[5],lVar6);
        varsub::param[3][0] = '\0';
        break;
      case 6:
        lVar6 = UnifInt(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                        (long)in_stack_ffffffffffffffa0);
        sprintf(varsub::param[1],varsub::formats[6],lVar6);
        lVar6 = UnifInt(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                        (long)in_stack_ffffffffffffffa0);
        sprintf(varsub::param[2],varsub::formats[7],lVar6);
        lVar6 = UnifInt(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                        (long)in_stack_ffffffffffffffa0);
        sprintf(varsub::param[3],"%ld",lVar6);
        varsub::param[4][0] = '\0';
        break;
      case 7:
        iVar2 = pick_str(in_stack_ffffffffffffffa0,iVar2,in_stack_ffffffffffffff90);
        do {
          iVar3 = pick_str(in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20)
                           ,in_stack_ffffffffffffff90);
        } while (iVar3 == iVar2);
        varsub::param[3][0] = '\0';
        break;
      case 8:
        iVar2 = pick_str(in_stack_ffffffffffffffa0,iVar2,in_stack_ffffffffffffff90);
        iVar3 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
        strcpy(varsub::param[2],regions.list[nations.list[iVar2].weight].text);
        pick_str(in_stack_ffffffffffffffa0,iVar3,in_stack_ffffffffffffff90);
        varsub::param[4][0] = '\0';
        break;
      case 9:
        pick_str(in_stack_ffffffffffffffa0,iVar2,in_stack_ffffffffffffff90);
        varsub::param[2][0] = '\0';
        break;
      case 10:
        lVar6 = UnifInt(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                        (long)in_stack_ffffffffffffffa0);
        sprintf(varsub::param[1],varsub::formats[10],lVar6 / 0xc + 0x5d,lVar6 % 0xc + 1);
        varsub::param[2][0] = '\0';
        break;
      case 0xb:
        pick_str(in_stack_ffffffffffffffa0,iVar2,in_stack_ffffffffffffff90);
        sprintf(varsub::param[2],"%11.10f",0.0001 / flt_scale);
        varsub::param[3][0] = '\0';
        break;
      case 0xc:
        iVar2 = pick_str(in_stack_ffffffffffffffa0,iVar2,in_stack_ffffffffffffff90);
        do {
          nStream = (distribution *)(long)iVar2;
          iVar3 = pick_str((distribution *)(long)iVar2,
                           (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),in_stack_ffffffffffffff90
                          );
        } while (nStream == (distribution *)(long)iVar3);
        lVar6 = UnifInt(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(long)nStream);
        sprintf(varsub::param[3],varsub::formats[0xc],lVar6);
        varsub::param[4][0] = '\0';
        break;
      case 0xd:
        pick_str(in_stack_ffffffffffffffa0,iVar2,in_stack_ffffffffffffff90);
        pick_str(in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                 in_stack_ffffffffffffff90);
        varsub::param[3][0] = '\0';
        break;
      case 0xe:
        lVar6 = UnifInt(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                        (long)in_stack_ffffffffffffffa0);
        sprintf(varsub::param[1],varsub::formats[0xe],lVar6 / 0xc + 0x5d,lVar6 % 0xc + 1);
        varsub::param[2][0] = '\0';
        break;
      case 0xf:
        lVar6 = UnifInt(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                        (long)in_stack_ffffffffffffffa0);
        sprintf(varsub::param[1],varsub::formats[0xf],lVar6 / 0xc + 0x5d,lVar6 % 0xc + 1);
        varsub::param[2][0] = '\0';
        break;
      case 0x10:
        lVar6 = UnifInt(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                        (long)in_stack_ffffffffffffffa0);
        iVar2 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
        lVar5 = UnifInt(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                        (long)in_stack_ffffffffffffffa0);
        sprintf(varsub::param[1],varsub::formats[0x10],lVar6,lVar5);
        pick_str(in_stack_ffffffffffffffa0,iVar2,in_stack_ffffffffffffff90);
        sVar4 = strlen(varsub::param[2]);
        local_20 = varsub::param[2] + (int)sVar4;
        do {
          pcVar7 = local_20 + -1;
          pcVar1 = local_20 + -1;
          local_20 = pcVar7;
        } while (*pcVar1 != ' ');
        *pcVar7 = '\0';
        permute((long *)in_stack_ffffffffffffffa0,iVar2,(long)in_stack_ffffffffffffff90);
        for (local_24 = 3; local_24 < 0xb; local_24 = local_24 + 1) {
          sprintf(varsub::param[local_24],"%ld",sizes[local_24 + -3]);
        }
        break;
      case 0x11:
        lVar6 = UnifInt(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                        (long)in_stack_ffffffffffffffa0);
        iVar2 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
        lVar5 = UnifInt(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                        (long)in_stack_ffffffffffffffa0);
        sprintf(varsub::param[1],varsub::formats[0x11],lVar6,lVar5);
        pick_str(in_stack_ffffffffffffffa0,iVar2,in_stack_ffffffffffffff90);
        varsub::param[3][0] = '\0';
        break;
      case 0x12:
        lVar6 = UnifInt(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                        (long)in_stack_ffffffffffffffa0);
        sprintf(varsub::param[1],"%ld",lVar6);
        varsub::param[2][0] = '\0';
        break;
      case 0x13:
        lVar6 = UnifInt(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                        (long)in_stack_ffffffffffffffa0);
        lVar5 = UnifInt(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                        (long)in_stack_ffffffffffffffa0);
        sprintf(varsub::param[1],varsub::formats[0x13],lVar6,lVar5);
        lVar6 = UnifInt(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                        (long)in_stack_ffffffffffffffa0);
        lVar5 = UnifInt(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                        (long)in_stack_ffffffffffffffa0);
        sprintf(varsub::param[2],varsub::formats[0x13],lVar6,lVar5);
        lVar6 = UnifInt(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                        (long)in_stack_ffffffffffffffa0);
        lVar5 = UnifInt(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                        (long)in_stack_ffffffffffffffa0);
        sprintf(varsub::param[3],varsub::formats[0x13],lVar6,lVar5);
        lVar6 = UnifInt(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                        (long)in_stack_ffffffffffffffa0);
        sprintf(varsub::param[4],"%ld",lVar6);
        lVar6 = UnifInt(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                        (long)in_stack_ffffffffffffffa0);
        sprintf(varsub::param[5],"%ld",lVar6);
        lVar6 = UnifInt(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                        (long)in_stack_ffffffffffffffa0);
        sprintf(varsub::param[6],"%ld",lVar6);
        varsub::param[7][0] = '\0';
        break;
      case 0x14:
        pick_str(in_stack_ffffffffffffffa0,iVar2,in_stack_ffffffffffffff90);
        iVar2 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
        lVar6 = UnifInt(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                        (long)in_stack_ffffffffffffffa0);
        sprintf(varsub::param[2],varsub::formats[0x14],lVar6);
        pick_str(in_stack_ffffffffffffffa0,iVar2,in_stack_ffffffffffffff90);
        varsub::param[4][0] = '\0';
        break;
      case 0x15:
        pick_str(in_stack_ffffffffffffffa0,iVar2,in_stack_ffffffffffffff90);
        varsub::param[2][0] = '\0';
        break;
      case 0x16:
        permute((long *)in_stack_ffffffffffffffa0,iVar2,(long)in_stack_ffffffffffffff90);
        for (local_24 = 0; local_24 < 8; local_24 = local_24 + 1) {
          sprintf(varsub::param[local_24 + 1],"%ld",ccode[local_24] + 10);
        }
        varsub::param[8][0] = '\0';
        break;
      case 0x17:
      case 0x18:
        break;
      default:
        fprintf(_stderr,"No variable definitions available for query %d\n",(ulong)in_EDI);
        return;
      }
    }
    if ((in_EDX & 0x40) != 0) {
      if ((varsub::lfp == (FILE *)0x0) &&
         (varsub::lfp = (FILE *)fopen64(lfile,"a"), (FILE *)varsub::lfp == (FILE *)0x0)) {
        fprintf(_stderr,"Open failed for %s at %s:%d\n",lfile,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/eyalroz[P]tpch-dbgen/src/varsub.c"
                ,0x117);
        exit(1);
      }
      fprintf((FILE *)varsub::lfp,"%d",(ulong)in_EDI);
      for (local_24 = 1; local_24 < 0xb; local_24 = local_24 + 1) {
        if ((in_EDX & 1) == 0) {
          if (varsub::param[local_24][0] == '\0') break;
          fprintf((FILE *)varsub::lfp,"\t%s",varsub::param + local_24);
        }
        else {
          if (defaults[(int)(in_EDI - 1)][local_24 + -1] == (char *)0x0) break;
          fprintf((FILE *)varsub::lfp,"\t%s",defaults[(int)(in_EDI - 1)][local_24 + -1]);
        }
      }
      fprintf((FILE *)varsub::lfp,"\n");
    }
  }
  else if ((in_EDX & 1) == 0) {
    if (((int)in_ESI < 0xb) && (varsub::param[(int)in_ESI][0] != '\0')) {
      fprintf(_stdout,"%s",varsub::param + (int)in_ESI);
    }
    else {
      fprintf(_stderr,"Bad parameter request (q: %d, p: %d)\n",(ulong)in_EDI,(ulong)in_ESI);
    }
  }
  else if ((in_EDI == 0xb) && (in_ESI == 2)) {
    fprintf(_stdout,"%11.10f",0.0001 / flt_scale);
  }
  else if (defaults[(int)(in_EDI - 1)][(int)(in_ESI - 1)] == (char *)0x0) {
    fprintf(_stderr,"Bad default request (q: %d, p: %d)\n",(ulong)in_EDI,(ulong)in_ESI);
  }
  else {
    fprintf(_stdout,"%s",defaults[(int)(in_EDI - 1)][(int)(in_ESI - 1)]);
  }
  return;
}

Assistant:

void
varsub(int qnum, int vnum, int flags)
{
    static char param[11][128];
    static char formats[23][128];
    static FILE *lfp = NULL;
    static int bInit = 0;
    long *lptr;
    char *ptr;
    int i = 0;
    DSS_HUGE tmp_date, tmp1, tmp2;
	
    if (!bInit)
    {
        sprintf(formats[4], "19%s-%s-01", HUGE_DATE_FORMAT, HUGE_DATE_FORMAT);
        sprintf(formats[5], "19%s-01-01", HUGE_DATE_FORMAT);
        sprintf(formats[6], "19%s-01-01", HUGE_DATE_FORMAT);
        sprintf(formats[7], "0.%s", HUGE_DATE_FORMAT); /* used by q6 */
        sprintf(formats[10], "19%s-%s-01", HUGE_DATE_FORMAT, HUGE_DATE_FORMAT);
        sprintf(formats[12], "19%s-01-01", HUGE_DATE_FORMAT);
        sprintf(formats[14], "19%s-%s-01", HUGE_DATE_FORMAT, HUGE_DATE_FORMAT);
        sprintf(formats[15], "19%s-%s-01", HUGE_DATE_FORMAT, HUGE_DATE_FORMAT);
	     sprintf(formats[16], "Brand#%s%s", HUGE_FORMAT, HUGE_FORMAT);
	     sprintf(formats[17], "Brand#%s%s", HUGE_FORMAT, HUGE_FORMAT);
	     sprintf(formats[19], "Brand#%s%s", HUGE_FORMAT, HUGE_FORMAT);
        sprintf(formats[20], "19%s-01-01", HUGE_DATE_FORMAT);
        bInit = 1;
    }

    if (vnum == 0)
    {
		if ((flags & DFLT) == 0)
		{
			switch(qnum)
			{
			case 1:
				sprintf(param[1], HUGE_FORMAT, UnifInt((DSS_HUGE)60,(DSS_HUGE)120,qnum));
				param[2][0] = '\0';
				break;
			case 2:
				sprintf(param[1], HUGE_FORMAT,
					UnifInt((DSS_HUGE)P_SIZE_MIN, (DSS_HUGE)P_SIZE_MAX, qnum));
				pick_str(&p_types_set, qnum, param[3]);
				ptr = param[3] + (int)strlen(param[3]);
				while (*(ptr - 1) != ' ') ptr--;
				strcpy(param[2], ptr);
				pick_str(&regions, qnum, param[3]);
				param[4][0] = '\0';
				break;
			case 3:
				pick_str(&c_mseg_set, qnum, param[1]);
				/*
				* pick a random offset within the month of march and add the
				* appropriate magic numbers to position the output functions 
				* at the start of March '95
				*/
            RANDOM(tmp_date, 0, 30, qnum);
				strcpy(param[2], *(asc_date + tmp_date + 1155));
				param[3][0] = '\0';
				break;
			case 4:
				tmp_date = UnifInt((DSS_HUGE)0,(DSS_HUGE)57,qnum);
				sprintf(param[1],formats[4],
					93 + tmp_date/12, tmp_date%12 + 1);
				param[2][0] = '\0';
				break;
			case 5:
				pick_str(&regions, qnum, param[1]);
				tmp_date = UnifInt((DSS_HUGE)93, (DSS_HUGE)97,qnum);
				sprintf(param[2], formats[5], tmp_date);
				param[3][0] = '\0';
				break;
			case 6:
				tmp_date = UnifInt((DSS_HUGE)93,(DSS_HUGE)97,qnum);
				sprintf(param[1], formats[6], tmp_date);
				sprintf(param[2], formats[7], 
                                    UnifInt((DSS_HUGE)2, (DSS_HUGE)9, qnum));
				sprintf(param[3], HUGE_FORMAT, UnifInt((DSS_HUGE)24, (DSS_HUGE)25, qnum));
				param[4][0] = '\0';
				break;
			case 7:
				tmp_date = pick_str(&nations2, qnum, param[1]);
				while (pick_str(&nations2, qnum, param[2]) == tmp_date);
				param[3][0] = '\0';
				break;
			case 8:
				tmp_date = pick_str(&nations2, qnum, param[1]);
				tmp_date = nations.list[tmp_date].weight;
				strcpy(param[2], regions.list[tmp_date].text);
				pick_str(&p_types_set, qnum, param[3]);
				param[4][0] = '\0';
				break;
			case 9:
				pick_str(&colors, qnum, param[1]);
				param[2][0] = '\0';
				break;
			case 10:
				tmp_date = UnifInt((DSS_HUGE)1,(DSS_HUGE)24,qnum);
				sprintf(param[1],formats[10],
					93 + tmp_date/12, tmp_date%12 + 1);
				param[2][0] = '\0';
				break;
			case 11:
				pick_str(&nations2, qnum, param[1]);
				sprintf(param[2], "%11.10f", Q11_FRACTION / flt_scale );
				param[3][0] = '\0';
				break;
			case 12:
				tmp_date = pick_str(&l_smode_set, qnum, param[1]);
				while (tmp_date == pick_str(&l_smode_set, qnum, param[2]));
				tmp_date = UnifInt((DSS_HUGE)93,(DSS_HUGE)97,qnum);
				sprintf(param[3], formats[12], tmp_date);
				param[4][0] = '\0';
				break;
			case 13:
				pick_str(&q13a, qnum, param[1]);
				pick_str(&q13b, qnum, param[2]);
				param[3][0] = '\0';
				break;
			case 14:
				tmp_date = UnifInt((DSS_HUGE)0,(DSS_HUGE)59,qnum);
				sprintf(param[1],formats[14],
					93 + tmp_date/12, tmp_date%12 + 1);
				param[2][0] = '\0';
				break;
			case 15:
				tmp_date = UnifInt((DSS_HUGE)0,(DSS_HUGE)57,qnum);
				sprintf(param[1],formats[15],
					93 + tmp_date/12, tmp_date%12 + 1);
				param[2][0] = '\0';
				break;
			case 16:
				tmp1 = UnifInt((DSS_HUGE)1, (DSS_HUGE)5, qnum); 
				tmp2 = UnifInt((DSS_HUGE)1, (DSS_HUGE)5, qnum);
				sprintf(param[1], formats[16], tmp1, tmp2);
				pick_str(&p_types_set, qnum, param[2]);
				ptr = param[2] + (int)strlen(param[2]);
				while (*(--ptr) != ' ');
				*ptr = '\0';
				lptr = &sizes[0];
				permute(lptr,50,qnum);
				for (i=3; i <= MAX_PARAM; i++)
					sprintf(param[i], "%ld", sizes[i - 3]);
				break;
			case 17:
				tmp1 = UnifInt((DSS_HUGE)1, (DSS_HUGE)5, qnum); 
				tmp2 = UnifInt((DSS_HUGE)1, (DSS_HUGE)5, qnum);
				sprintf(param[1], formats[17], tmp1, tmp2);
				pick_str(&p_cntr_set, qnum, param[2]);
				param[3][0] = '\0';
				break;
			case 18:
				sprintf(param[1], HUGE_FORMAT, UnifInt((DSS_HUGE)312, (DSS_HUGE)315, qnum));
				param[2][0] = '\0';
				break;
			case 19:
				tmp1 = UnifInt((DSS_HUGE)1, (DSS_HUGE)5, qnum); 
				tmp2 = UnifInt((DSS_HUGE)1, (DSS_HUGE)5, qnum);
				sprintf(param[1], formats[19], tmp1, tmp2);
				tmp1 = UnifInt((DSS_HUGE)1, (DSS_HUGE)5, qnum); 
				tmp2 = UnifInt((DSS_HUGE)1, (DSS_HUGE)5, qnum);
				sprintf(param[2], formats[19], tmp1, tmp2);
				tmp1 = UnifInt((DSS_HUGE)1, (DSS_HUGE)5, qnum); 
				tmp2 = UnifInt((DSS_HUGE)1, (DSS_HUGE)5, qnum);
				sprintf(param[3], formats[19], tmp1, tmp2);
				sprintf(param[4], HUGE_FORMAT, UnifInt((DSS_HUGE)1, (DSS_HUGE)10, qnum));
				sprintf(param[5], HUGE_FORMAT, UnifInt((DSS_HUGE)10, (DSS_HUGE)20, qnum));
				sprintf(param[6], HUGE_FORMAT, UnifInt((DSS_HUGE)20, (DSS_HUGE)30, qnum));
				param[7][0] = '\0';
				break;
			case 20:
				pick_str(&colors, qnum, param[1]);
				tmp_date = UnifInt((DSS_HUGE)93,(DSS_HUGE)97,qnum);
				sprintf(param[2], formats[20], tmp_date);
				pick_str(&nations2, qnum, param[3]);
				param[4][0] = '\0';
				break;
			case 21:
				pick_str(&nations2, qnum, param[1]);
				param[2][0] = '\0';
				break;
			case 22:
				lptr = &ccode[0];
				permute(lptr,25, qnum);
				for (i=0; i <= 7; i++)
					sprintf(param[i+1], "%ld", 10 + ccode[i]);
				param[8][0] = '\0';
				break;
			case 23:
			case 24:
                break;
			default:
				fprintf(stderr, 
					"No variable definitions available for query %d\n", 
                    qnum);
				return;
        }
    }
	
    if (flags & LOG)
	{
        if (lfp == NULL)
		{
            lfp = fopen(lfile, "a");
            OPEN_CHECK(lfp, lfile);
		}
        fprintf(lfp, "%d", qnum);
        for (i=1; i <= 10; i++)
            if (flags & DFLT)
			{
				if (defaults[qnum - 1][i - 1] == NULL)
					break;
				else
					fprintf(lfp, "\t%s", defaults[qnum - 1][i - 1]);
			}
            else
			{
				if (param[i][0] == '\0')
					break;
				else
					fprintf(lfp, "\t%s", param[i]);
			}
			fprintf(lfp, "\n");
	}
    }
    else
	{
        if (flags & DFLT)   
		{
            /* to allow -d to work at all scale factors */
            if (qnum == 11 && vnum == 2)
                fprintf(ofp, "%11.10f", Q11_FRACTION/flt_scale);
            else
                if (defaults[qnum - 1][vnum - 1])
                    fprintf(ofp, "%s", defaults[qnum - 1][vnum - 1]);
                else
					fprintf(stderr, 
					"Bad default request (q: %d, p: %d)\n",
					qnum, vnum);
		}
        else        
		{
            if (vnum <= MAX_PARAM && param[vnum][0] != '\0')
                fprintf(ofp, "%s", param[vnum]);
            else
				fprintf(stderr, "Bad parameter request (q: %d, p: %d)\n",
				qnum, vnum);
		}
	}
    return;
}